

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O1

int jas_image_ishomosamp(jas_image_t *image)

{
  jas_image_cmpt_t *pjVar1;
  jas_image_cmpt_t *pjVar2;
  long lVar3;
  
  if (image->numcmpts_ != 0) {
    pjVar1 = *image->cmpts_;
    lVar3 = 0;
    do {
      pjVar2 = image->cmpts_[lVar3];
      if ((pjVar2->hstep_ != pjVar1->hstep_) || (pjVar2->vstep_ != pjVar1->vstep_)) {
        return 0;
      }
      lVar3 = lVar3 + 1;
    } while (image->numcmpts_ != (uint)lVar3);
  }
  return 1;
}

Assistant:

int jas_image_ishomosamp(const jas_image_t *image)
{
	jas_image_coord_t hstep;
	jas_image_coord_t vstep;
	int result;
	hstep = jas_image_cmpthstep(image, 0);
	vstep = jas_image_cmptvstep(image, 0);
	result = 1;
	for (unsigned i = 0; i < image->numcmpts_; ++i) {
		if (jas_image_cmpthstep(image, i) != hstep ||
		  jas_image_cmptvstep(image, i) != vstep) {
			result = 0;
			break;
		}
	}
	return result;
}